

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O0

void __thiscall
sqlite::Connection::exec
          (Connection *this,string *sql,_func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr *callback,
          void *arg)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  sqlite3 *in_RDI;
  string err;
  int status;
  char *err_msg;
  int sqlite_error_code;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar3;
  string *in_stack_ffffffffffffff78;
  Logic_error *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  allocator local_51;
  string local_50 [36];
  int local_2c;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_28 = (char *)0x0;
  uVar2 = *(undefined8 *)in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  uVar1 = std::__cxx11::string::c_str();
  local_2c = sqlite3_exec(uVar2,uVar1,local_18,local_20,&local_28);
  sqlite_error_code = (int)((ulong)uVar2 >> 0x20);
  if ((local_28 == (char *)0x0) && (local_2c == 0)) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"",&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (local_28 != (char *)0x0) {
    std::__cxx11::string::operator=(local_50,local_28);
    sqlite3_free(local_28);
  }
  uVar3 = 1;
  uVar2 = __cxa_allocate_exception(0x48);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  Logic_error::Logic_error
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (string *)CONCAT17(uVar3,in_stack_ffffffffffffff70),sqlite_error_code,in_RDI);
  __cxa_throw(uVar2,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::exec(const std::string & sql, int (*callback)(void *, int, char **, char **), void * arg)
    {
        char * err_msg = nullptr;
        int status = sqlite3_exec(db_, sql.c_str(), callback, arg, &err_msg);

        if(err_msg || status != SQLITE_OK)
        {
            std::string err = "";
            if(err_msg)
            {
                err = err_msg;
                sqlite3_free(err_msg);
            }
            throw Logic_error("Error evaluating SQL: " + err, sql, status, db_);
        }
    }